

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raymath.h
# Opt level: O2

Quaternion QuaternionFromAxisAngle(Vector3 axis,float angle)

{
  uint uVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  Quaternion QVar9;
  
  fVar7 = axis.z;
  fVar5 = axis.x;
  fVar6 = axis.y;
  fVar2 = SQRT(fVar7 * fVar7 + fVar5 * fVar5 + fVar6 * fVar6);
  if ((fVar2 == 0.0) && (!NAN(fVar2))) {
    return (Quaternion)(ZEXT816(0x3f80000000000000) << 0x40);
  }
  fVar2 = 1.0 / fVar2;
  fVar3 = sinf(angle * 0.5);
  fVar4 = cosf(angle * 0.5);
  fVar8 = fVar7 * fVar2 * fVar3;
  fVar7 = fVar3 * fVar2 * fVar5;
  fVar3 = fVar3 * fVar2 * fVar6;
  fVar5 = SQRT(fVar4 * fVar4 + fVar8 * fVar8 + fVar7 * fVar7 + fVar3 * fVar3);
  uVar1 = -(uint)(fVar5 == 0.0);
  fVar5 = (float)(uVar1 & 0x3f800000 | ~uVar1 & (uint)(1.0 / fVar5));
  QVar9.x = fVar7 * fVar5;
  QVar9.y = fVar3 * fVar5;
  QVar9.z = fVar5 * fVar8;
  QVar9.w = fVar5 * fVar4;
  return QVar9;
}

Assistant:

RMAPI Quaternion QuaternionFromAxisAngle(Vector3 axis, float angle)
{
    Quaternion result = { 0.0f, 0.0f, 0.0f, 1.0f };

    float axisLength = sqrtf(axis.x*axis.x + axis.y*axis.y + axis.z*axis.z);

    if (axisLength != 0.0f)
    {
        angle *= 0.5f;

        float length = 0.0f;
        float ilength = 0.0f;

        // Vector3Normalize(axis)
        length = axisLength;
        if (length == 0.0f) length = 1.0f;
        ilength = 1.0f/length;
        axis.x *= ilength;
        axis.y *= ilength;
        axis.z *= ilength;

        float sinres = sinf(angle);
        float cosres = cosf(angle);

        result.x = axis.x*sinres;
        result.y = axis.y*sinres;
        result.z = axis.z*sinres;
        result.w = cosres;

        // QuaternionNormalize(q);
        Quaternion q = result;
        length = sqrtf(q.x*q.x + q.y*q.y + q.z*q.z + q.w*q.w);
        if (length == 0.0f) length = 1.0f;
        ilength = 1.0f/length;
        result.x = q.x*ilength;
        result.y = q.y*ilength;
        result.z = q.z*ilength;
        result.w = q.w*ilength;
    }

    return result;
}